

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

_Bool tcg_region_alloc__locked(TCGContext_conflict9 *s)

{
  bool bVar1;
  TCGContext_conflict9 *s_local;
  
  bVar1 = (s->region).current != (s->region).n;
  if (bVar1) {
    tcg_region_assign(s,(s->region).current);
    (s->region).current = (s->region).current + 1;
  }
  s_local._7_1_ = !bVar1;
  return s_local._7_1_;
}

Assistant:

static bool tcg_region_alloc__locked(TCGContext *s)
{
    if (s->region.current == s->region.n) {
        return true;
    }
    tcg_region_assign(s, s->region.current);
    s->region.current++;
    return false;
}